

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O1

void VP8IteratorInit(VP8Encoder *enc,VP8EncIterator *it)

{
  VP8Encoder *pVVar1;
  int iVar2;
  uint8_t *puVar3;
  
  it->enc = enc;
  puVar3 = (uint8_t *)((ulong)(it->yuv_mem + 0x1f) & 0xffffffffffffffe0);
  it->yuv_in = puVar3;
  it->yuv_out = puVar3 + 0x200;
  it->yuv_out2 = puVar3 + 0x400;
  it->yuv_p = puVar3 + 0x600;
  it->lf_stats = enc->lf_stats;
  it->percent0 = enc->percent;
  puVar3 = (uint8_t *)((ulong)(it->yuv_left_mem + 0x20) & 0xffffffffffffffe0);
  it->y_left = puVar3;
  it->u_left = puVar3 + 0x20;
  it->v_left = puVar3 + 0x30;
  it->top_derr = enc->top_derr;
  VP8IteratorSetRow(it,0);
  iVar2 = enc->mb_h * enc->mb_w;
  it->count_down0 = iVar2;
  it->count_down = iVar2;
  pVVar1 = it->enc;
  memset(pVVar1->y_top,0x7f,(long)pVVar1->mb_w << 5);
  memset(pVVar1->nz,0,(long)pVVar1->mb_w << 2);
  if (pVVar1->top_derr != (DError *)0x0) {
    memset(pVVar1->top_derr,0,(long)pVVar1->mb_w << 2);
  }
  it->bit_count[3][1] = 0;
  it->bit_count[3][2] = 0;
  it->bit_count[2][2] = 0;
  it->bit_count[3][0] = 0;
  it->bit_count[2][0] = 0;
  it->bit_count[2][1] = 0;
  it->bit_count[1][1] = 0;
  it->bit_count[1][2] = 0;
  it->bit_count[0][2] = 0;
  it->bit_count[1][0] = 0;
  it->bit_count[0][0] = 0;
  it->bit_count[0][1] = 0;
  it->do_trellis = 0;
  return;
}

Assistant:

void VP8IteratorInit(VP8Encoder* const enc, VP8EncIterator* const it) {
  it->enc = enc;
  it->yuv_in   = (uint8_t*)WEBP_ALIGN(it->yuv_mem);
  it->yuv_out  = it->yuv_in + YUV_SIZE_ENC;
  it->yuv_out2 = it->yuv_out + YUV_SIZE_ENC;
  it->yuv_p    = it->yuv_out2 + YUV_SIZE_ENC;
  it->lf_stats = enc->lf_stats;
  it->percent0 = enc->percent;
  it->y_left = (uint8_t*)WEBP_ALIGN(it->yuv_left_mem + 1);
  it->u_left = it->y_left + 16 + 16;
  it->v_left = it->u_left + 16;
  it->top_derr = enc->top_derr;
  VP8IteratorReset(it);
}